

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string-view.cc
# Opt level: O0

string * __thiscall
wabt::string_view::to_string_abi_cxx11_(string *__return_storage_ptr__,string_view *this)

{
  char *pcVar1;
  ulong uVar2;
  allocator local_19;
  string_view *local_18;
  string_view *this_local;
  
  pcVar1 = this->data_;
  uVar2 = this->size_;
  local_18 = this;
  this_local = (string_view *)__return_storage_ptr__;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)__return_storage_ptr__,pcVar1,uVar2,&local_19);
  std::allocator<char>::~allocator((allocator<char> *)&local_19);
  return __return_storage_ptr__;
}

Assistant:

std::string string_view::to_string() const {
  return std::string(data_, size_);
}